

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O1

int json_pointer_getf(json_object *obj,json_object **res,char *path_fmt,...)

{
  char in_AL;
  int iVar1;
  int *piVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *path_copy;
  json_pointer_get_result res_1;
  va_list args;
  char *local_110;
  json_pointer_get_result local_108;
  undefined8 local_e8;
  char **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_110 = (char *)0x0;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (obj == (json_object *)0x0 || path_fmt == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    local_d8 = local_c8;
    local_e0 = &path_copy;
    local_e8 = 0x3000000018;
    iVar1 = vasprintf(&local_110,path_fmt,&local_e8);
    if (-1 < iVar1) {
      if (*local_110 == '\0') {
        if (res != (json_object **)0x0) {
          *res = obj;
        }
      }
      else {
        iVar1 = json_pointer_result_get_recursive(obj,local_110,&local_108);
        if (iVar1 == 0) {
          iVar1 = 0;
          if (res != (json_object **)0x0) {
            *res = local_108.obj;
            iVar1 = 0;
          }
        }
      }
      free(local_110);
    }
  }
  return iVar1;
}

Assistant:

int json_pointer_getf(struct json_object *obj, struct json_object **res, const char *path_fmt, ...)
{
	char *path_copy = NULL;
	int rc = 0;
	va_list args;

	if (!obj || !path_fmt)
	{
		errno = EINVAL;
		return -1;
	}

	va_start(args, path_fmt);
	rc = vasprintf(&path_copy, path_fmt, args);
	va_end(args);

	if (rc < 0)
		return rc;

	if (path_copy[0] == '\0')
	{
		if (res)
			*res = obj;
		goto out;
	}

	rc = json_pointer_object_get_recursive(obj, path_copy, res);
out:
	free(path_copy);

	return rc;
}